

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_rsa_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  size_t __n;
  int iVar2;
  char *__s1;
  uchar *type;
  size_t type_len;
  size_t n_len;
  size_t e_len;
  uchar *n;
  uchar *e;
  RSA *rsactx;
  string_buf buf;
  
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_rsa_dtor(session,abstract);
    *abstract = (void *)0x0;
  }
  iVar2 = -1;
  if (hostkey_data_len < 0x13) {
    return -1;
  }
  buf.data = hostkey_data;
  buf.dataptr = hostkey_data;
  buf.len = hostkey_data_len;
  iVar1 = _libssh2_get_string(&buf,&type,&type_len);
  if (iVar1 != 0) {
    return -1;
  }
  if (type_len == 0xc) {
    iVar1 = strncmp("rsa-sha2-256",(char *)type,0xc);
    if (iVar1 == 0) goto LAB_0011de75;
    __s1 = "rsa-sha2-512";
    __n = 0xc;
  }
  else {
    if (type_len != 7) {
      return -1;
    }
    __s1 = "ssh-rsa";
    __n = 7;
  }
  iVar1 = strncmp(__s1,(char *)type,__n);
  if (iVar1 != 0) {
    return -1;
  }
LAB_0011de75:
  iVar1 = _libssh2_get_string(&buf,&e,&e_len);
  if ((((iVar1 == 0) && (iVar1 = _libssh2_get_string(&buf,&n,&n_len), iVar1 == 0)) &&
      (iVar1 = _libssh2_eob(&buf), iVar1 != 0)) &&
     (iVar1 = _libssh2_rsa_new(&rsactx,e,e_len,n,n_len,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                               (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0), iVar1 == 0)) {
    *abstract = rsactx;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_rsa_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    unsigned char *e, *n, *type;
    size_t e_len, n_len, type_len;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 19) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_get_string(&buf, &type, &type_len)) {
        return -1;
    }

    /* we accept one of 3 header types */
#if LIBSSH2_RSA_SHA1
    if(type_len == 7 && strncmp("ssh-rsa", (char *)type, 7) == 0) {
        /* ssh-rsa */
    }
    else
#endif
#if LIBSSH2_RSA_SHA2
    if(type_len == 12 && strncmp("rsa-sha2-256", (char *)type, 12) == 0) {
        /* rsa-sha2-256 */
    }
    else if(type_len == 12 && strncmp("rsa-sha2-512", (char *)type, 12) == 0) {
        /* rsa-sha2-512 */
    }
    else
#endif
    {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "unexpected rsa type: %.*s", type_len, type));
        return -1;
    }

    if(_libssh2_get_string(&buf, &e, &e_len))
        return -1;

    if(_libssh2_get_string(&buf, &n, &n_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_rsa_new(&rsactx,
                        e, (unsigned long)e_len,
                        n, (unsigned long)n_len,
                        NULL, 0, NULL, 0, NULL, 0,
                        NULL, 0, NULL, 0, NULL, 0)) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}